

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss_pyramid.h
# Opt level: O2

void gimage::expandGauss<float,float>
               (Image<float,_gimage::PixelTraits<float>_> *target,
               Image<float,_gimage::PixelTraits<float>_> *image)

{
  long i_00;
  long lVar1;
  long lVar2;
  long h;
  long lVar3;
  long k;
  ulong k_00;
  long i;
  long lVar4;
  long lVar5;
  float *pfVar6;
  int j;
  long lVar7;
  long w;
  float fVar8;
  
  lVar1 = image->width;
  lVar2 = image->height;
  w = lVar1 * 2;
  h = lVar2 * 2;
  Image<float,_gimage::PixelTraits<float>_>::setSize(target,w,h,(long)image->depth);
  lVar2 = lVar2 * 2 + -2;
  i_00 = lVar1 * 2 + -2;
  lVar7 = 0;
  lVar3 = 0;
  if (0 < lVar2) {
    lVar3 = lVar2;
  }
  if (w < 1) {
    w = lVar7;
  }
  for (; lVar7 < target->depth; lVar7 = lVar7 + 1) {
    pfVar6 = *target->img[lVar7];
    for (k_00 = 0; (j = (int)lVar7, k_00 < 2 && ((long)k_00 < h)); k_00 = k_00 + 1) {
      for (lVar4 = 0; w != lVar4; lVar4 = lVar4 + 1) {
        fVar8 = expandGaussPixel<float>(image,lVar4,k_00,j);
        *pfVar6 = fVar8;
        pfVar6 = pfVar6 + 1;
      }
    }
    for (lVar4 = 2; lVar5 = lVar3, lVar4 < lVar2; lVar4 = lVar4 + 1) {
      if (0 < lVar1) {
        fVar8 = expandGaussPixel<float>(image,0,lVar4,j);
        *pfVar6 = fVar8;
        fVar8 = expandGaussPixel<float>(image,1,lVar4,j);
        pfVar6[1] = fVar8;
        pfVar6 = pfVar6 + 2;
      }
      for (lVar5 = 2; lVar5 < i_00; lVar5 = lVar5 + 1) {
        fVar8 = expandGaussPixelInner<float>(image,lVar5,lVar4,j);
        *pfVar6 = fVar8;
        pfVar6 = pfVar6 + 1;
      }
      if (1 < lVar1) {
        fVar8 = expandGaussPixel<float>(image,i_00,lVar4,j);
        *pfVar6 = fVar8;
        fVar8 = expandGaussPixel<float>(image,lVar1 * 2 + -1,lVar4,j);
        pfVar6[1] = fVar8;
        pfVar6 = pfVar6 + 2;
      }
    }
    for (; lVar5 < h; lVar5 = lVar5 + 1) {
      for (lVar4 = 0; w != lVar4; lVar4 = lVar4 + 1) {
        fVar8 = expandGaussPixel<float>(image,lVar4,lVar5,j);
        *pfVar6 = fVar8;
        pfVar6 = pfVar6 + 1;
      }
    }
  }
  return;
}

Assistant:

void expandGauss(Image<T> &target, const Image<S> &image)
{
  const long w=2*image.getWidth();
  const long h=2*image.getHeight();

  target.setSize(w, h, image.getDepth());

  // for all color channels

  for (int d=0; d<target.getDepth(); d++)
  {
    T *p=target.getPtr(0, 0, d);
    for (long k=0; k<2 && k<h; k++)
    {
      for (long i=0; i<w; i++)
      {
        *p++=static_cast<T>(expandGaussPixel(image, i, k, d));
      }
    }

    for (long k=2; k<h-2; k++)
    {
      if (w > 0) *p++=static_cast<T>(expandGaussPixel(image, 0, k, d));
      if (w > 1) *p++=static_cast<T>(expandGaussPixel(image, 1, k, d));

      for (long i=2; i<w-2; i++)
      {
        *p++=static_cast<T>(expandGaussPixelInner(image, i, k, d));
      }

      if (w > 2) *p++=static_cast<T>(expandGaussPixel(image, w-2, k, d));
      if (w > 3) *p++=static_cast<T>(expandGaussPixel(image, w-1, k, d));
    }

    for (long k=std::max(0l, h-2); k<h; k++)
    {
      for (long i=0; i<w; i++)
      {
        *p++=static_cast<T>(expandGaussPixel(image, i, k, d));
      }
    }
  }
}